

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  int iVar2;
  result rVar3;
  long lVar4;
  char cVar5;
  ulong uVar7;
  size_t __len;
  ulong uVar8;
  uint64_t error;
  undefined1 local_58 [8];
  grisu_shortest_handler handler;
  uint local_34 [2];
  int exp;
  char cVar6;
  
  if (value < (longdouble)0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x435,"value is negative");
  }
  if (value <= (longdouble)0) {
    if (precision < 1 || ((ulong)specs & 0xff00000000) != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar1 = buf->size_;
      buf->size_ = sVar1 + 1;
      buf->ptr_[sVar1] = '0';
      iVar2 = 0;
    }
    else {
      uVar7 = (ulong)(uint)precision;
      if (buf->capacity_ < uVar7) {
        (**buf->_vptr_buffer)(buf,uVar7);
      }
      uVar8 = buf->capacity_;
      if (uVar7 <= buf->capacity_) {
        uVar8 = uVar7;
      }
      buf->size_ = uVar8;
      memset(buf->ptr_,0x30,uVar7);
      iVar2 = -precision;
    }
  }
  else if (((ulong)specs >> 0x33 & 1) == 0) {
    iVar2 = snprintf_float<long_double>(value,precision,specs,buf);
  }
  else {
    local_34[0] = 0;
    if (precision < 0) {
      uVar7 = 0x26604b7a84467;
      local_58 = (undefined1  [8])buf->ptr_;
      handler.buf._0_4_ = 0;
      handler.size = -0x4857bb99;
      handler._12_4_ = 0x465e6604;
      local_34[0] = 4;
      uVar8 = 0x1197;
      stack0xffffffffffffffc0 = value;
      do {
        lVar4 = (long)(int)local_34[0];
        cVar6 = '\0';
        cVar5 = '\0';
        switch(local_34[0]) {
        case 1:
          cVar5 = (char)uVar8;
          uVar8 = 0;
          goto switchD_002381fc_caseD_a;
        case 2:
          cVar5 = (char)(uVar8 / 10);
          iVar2 = (int)(uVar8 / 10) * 10;
          break;
        case 3:
          cVar5 = (char)(uVar8 / 100);
          iVar2 = (int)(uVar8 / 100) * 100;
          break;
        case 4:
          iVar2 = (int)(uVar8 / 1000) * 1000;
          cVar5 = (char)(uVar8 / 1000);
          break;
        case 5:
          iVar2 = (int)(uVar8 / 10000) * 10000;
          cVar5 = '\0';
          break;
        case 6:
          iVar2 = (int)(uVar8 / 100000) * 100000;
          cVar5 = '\0';
          break;
        case 7:
          iVar2 = (int)(uVar8 / 1000000) * 1000000;
          cVar5 = cVar6;
          break;
        case 8:
          iVar2 = (int)(uVar8 / 10000000) * 10000000;
          cVar5 = cVar6;
          break;
        case 9:
          iVar2 = (int)(uVar8 / 100000000) * 100000000;
          cVar5 = cVar6;
          break;
        case 10:
          goto switchD_002381fc_caseD_a;
        default:
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                      ,0x367,"invalid number of digits");
        }
        uVar8 = (ulong)(uint)((int)uVar8 - iVar2);
switchD_002381fc_caseD_a:
        local_34[0] = local_34[0] - 1;
        rVar3 = grisu_shortest_handler::on_digit
                          ((grisu_shortest_handler *)local_58,cVar5 + '0',
                           *(long *)(basic_data<void>::bsr2log10 + lVar4 * 8 + 0x78) << 0x32,
                           uVar8 << 0x32 | 0x26604b7a84467,2,local_34[0],true);
        if (rVar3 != more) goto LAB_0023837d;
      } while (0 < (int)local_34[0]);
      error = 2;
      do {
        uVar8 = uVar7 * 10;
        error = error * 10;
        uVar7 = uVar8 & 0x3fffffffffffe;
        local_34[0] = local_34[0] - 1;
        rVar3 = grisu_shortest_handler::on_digit
                          ((grisu_shortest_handler *)local_58,(byte)(uVar8 >> 0x32) | 0x30,
                           0x4000000000000,uVar7,error,local_34[0],false);
      } while (rVar3 == more);
LAB_0023837d:
      uVar7 = (ulong)(uint)handler.buf;
      if (rVar3 == error) {
        local_34[0] = local_34[0] + (uint)handler.buf + 0xb;
        fallback_format<long_double>(stack0xffffffffffffffc0,buf,(int *)local_34);
        uVar7 = (ulong)local_34[0];
      }
      else {
        if ((int)(uint)handler.buf < 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                      ,0x13c,"negative value");
        }
        if (buf->capacity_ < uVar7) {
          (**buf->_vptr_buffer)(buf,uVar7);
        }
        if (buf->capacity_ < uVar7) {
          uVar7 = buf->capacity_;
        }
        buf->size_ = uVar7;
      }
      iVar2 = (int)uVar7;
      if (rVar3 != error) {
        iVar2 = local_34[0] + 0xc;
      }
    }
    else {
      if (precision < 0x12) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                    ,0x334,"");
      }
      iVar2 = snprintf_float<long_double>(value,precision,specs,buf);
    }
  }
  return iVar2;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.try_resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.try_resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}